

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O1

bool __thiscall TxIndex::CustomAppend(TxIndex *this,BlockInfo *block)

{
  CBlock *pCVar1;
  pointer psVar2;
  bool bVar3;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar4;
  size_type __n;
  long in_FS_OFFSET;
  vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_> vPos;
  vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_> local_78;
  CDiskTxPos local_60;
  SizeComputer local_50;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (block->height == 0) {
    bVar3 = true;
  }
  else {
    pCVar1 = block->data;
    if (pCVar1 == (CBlock *)0x0) {
      __assert_fail("block.data",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
                    ,0x3e,"virtual bool TxIndex::CustomAppend(const interfaces::BlockInfo &)");
    }
    local_60.super_FlatFilePos.nFile = block->file_number;
    local_60.super_FlatFilePos.nPos = block->data_pos;
    __n = (long)(pCVar1->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar1->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
    local_60.nTxOffset = 1;
    if ((0xfc < __n) && (local_60.nTxOffset = 3, 0xffff < __n)) {
      local_60.nTxOffset = (uint)(__n >> 0x20 != 0) * 4 + 5;
    }
    local_78.
    super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>::
    reserve(&local_78,__n);
    psVar4 = (block->data->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (block->data->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar2) {
      do {
        std::vector<std::pair<uint256,CDiskTxPos>,std::allocator<std::pair<uint256,CDiskTxPos>>>::
        emplace_back<transaction_identifier<false>const&,CDiskTxPos&>
                  ((vector<std::pair<uint256,CDiskTxPos>,std::allocator<std::pair<uint256,CDiskTxPos>>>
                    *)&local_78,
                   &((psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->hash,&local_60);
        local_50.nSize = 0;
        local_48.m_params = &::TX_WITH_WITNESS;
        local_48.m_substream = &local_50;
        SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                  ((psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,&local_48,&::TX_WITH_WITNESS);
        local_60.nTxOffset = local_60.nTxOffset + (int)local_50.nSize;
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar2);
    }
    bVar3 = DB::WriteTxs((this->m_db)._M_t.
                         super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
                         super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
                         super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl,&local_78);
    if (local_78.
        super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<std::pair<uint256,_CDiskTxPos>,_std::allocator<std::pair<uint256,_CDiskTxPos>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::CustomAppend(const interfaces::BlockInfo& block)
{
    // Exclude genesis block transaction because outputs are not spendable.
    if (block.height == 0) return true;

    assert(block.data);
    CDiskTxPos pos({block.file_number, block.data_pos}, GetSizeOfCompactSize(block.data->vtx.size()));
    std::vector<std::pair<uint256, CDiskTxPos>> vPos;
    vPos.reserve(block.data->vtx.size());
    for (const auto& tx : block.data->vtx) {
        vPos.emplace_back(tx->GetHash(), pos);
        pos.nTxOffset += ::GetSerializeSize(TX_WITH_WITNESS(*tx));
    }
    return m_db->WriteTxs(vPos);
}